

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayoutPrivate::setupHorizontalLayoutData(QFormLayoutPrivate *this,int width)

{
  bool bVar1;
  long lVar2;
  QFormLayoutItem *pQVar3;
  RowWrapPolicy RVar4;
  pointer ppQVar5;
  QFormLayoutItem **ppQVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int r;
  int iVar15;
  
  uVar10 = (ulong)(this->m_matrix).m_storage.d.size >> 1;
  RVar4 = QFormLayout::rowWrapPolicy(*(QFormLayout **)&(this->super_QLayoutPrivate).field_0x8);
  uVar11 = uVar10 & 0xffffffff;
  if ((int)uVar10 < 1) {
    uVar11 = 0;
  }
  r = 0;
  iVar15 = 0;
  for (lVar14 = 0; uVar11 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
    ppQVar5 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
    lVar2 = *(long *)((long)ppQVar5 + lVar14);
    ppQVar6 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()(&this->m_matrix,r,1);
    pQVar3 = *ppQVar6;
    if (lVar2 != 0 || pQVar3 != (QFormLayoutItem *)0x0) {
      if (lVar2 != 0) {
        if ((pQVar3 == (QFormLayoutItem *)0x0) ||
           (piVar8 = &this->maxLabelWidth, *(char *)(lVar2 + 0x2c) == '\0')) {
          piVar8 = (int *)(lVar2 + 0x14);
        }
        *(int *)(lVar2 + 0x38) = *piVar8;
        *(undefined4 *)(lVar2 + 0x34) = 0;
      }
      if (pQVar3 != (QFormLayoutItem *)0x0) {
        iVar7 = pQVar3->sbsHSpace + this->maxLabelWidth;
        iVar9 = width - iVar7;
        bVar1 = pQVar3->sideBySide;
        iVar12 = width;
        if (bVar1 != false) {
          iVar12 = iVar9;
        }
        iVar13 = 0;
        if (bVar1 != false) {
          iVar13 = iVar7;
        }
        if ((((RVar4 != WrapAllRows) && (bVar1 == false)) &&
            ((lVar2 != 0 || (iVar13 = 0, iVar12 = width, pQVar3->fullRow == false)))) &&
           (iVar13 = iVar7, iVar12 = iVar9, iVar9 < (pQVar3->sizeHint).wd.m_i)) {
          iVar13 = 0;
          iVar12 = width;
        }
        pQVar3->layoutWidth = iVar12;
        pQVar3->layoutPos = iVar13;
        iVar12 = (pQVar3->maxSize).wd.m_i;
        if (iVar15 <= iVar12) {
          iVar15 = iVar12;
        }
      }
    }
    r = r + 1;
  }
  this->formMaxWidth = iVar15 + this->maxLabelWidth;
  return;
}

Assistant:

void QFormLayoutPrivate::setupHorizontalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // requires setupVerticalLayoutData to be called first

    int fieldMaxWidth = 0;

    int rr = m_matrix.rowCount();
    bool wrapAllRows = (q->rowWrapPolicy() == QFormLayout::WrapAllRows);

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Totally ignore empty rows...
        if (!label && !field)
            continue;

        if (label) {
            // if there is a field, and we're side by side, we use maxLabelWidth
            // otherwise we just use the sizehint
            label->layoutWidth = (field && label->sideBySide) ? maxLabelWidth : label->sizeHint.width();
            label->layoutPos = 0;
        }

        if (field) {
            // This is the default amount allotted to fields in sbs
            int fldwidth = width - maxLabelWidth - field->sbsHSpace;

            // If we've split a row, we still decide to align
            // the field with all the other field if it will fit
            // Fields in sbs mode get the remnants of the maxLabelWidth
            if (!field->sideBySide) {
                if (wrapAllRows || (!label && field->fullRow) || field->sizeHint.width() > fldwidth) {
                    field->layoutWidth = width;
                    field->layoutPos = 0;
                } else {
                    field->layoutWidth = fldwidth;
                    field->layoutPos = width - fldwidth;
                }
            } else {
                // We're sbs, so we should have a label
                field->layoutWidth = fldwidth;
                field->layoutPos = width - fldwidth;
            }

            fieldMaxWidth = qMax(fieldMaxWidth, field->maxSize.width());
        }
    }

    formMaxWidth = maxLabelWidth + fieldMaxWidth;
}